

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O2

void __thiscall
Omega_h::Future<int>::Future
          (Future<int> *this,Read<int> *sendbuf,Write<int> *recvbuf,requests_type *requests,
          callback_type *callback)

{
  Write<int>::Write((Write<int> *)this,&sendbuf->write_);
  Write<int>::Write(&this->recvbuf_,recvbuf);
  std::function<Omega_h::Read<int>_(Omega_h::Write<int>)>::function(&this->callback_,callback);
  std::vector<int,_std::allocator<int>_>::vector(&this->requests_,requests);
  this->status_ = waiting;
  return;
}

Assistant:

Future<T>::Future(Read<T> sendbuf, Write<T> recvbuf,
    const requests_type&& requests, const callback_type callback)
    : sendbuf_(sendbuf),
      recvbuf_(recvbuf),
      callback_(callback),
      requests_(requests),
      status_(Status::waiting) {}